

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getGLWrapMode(WrapMode wrapMode)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  WrapMode local_10;
  deUint32 local_c;
  WrapMode wrapMode_local;
  
  switch(wrapMode) {
  case CLAMP_TO_EDGE:
    local_c = 0x812f;
    break;
  case CLAMP_TO_BORDER:
    local_c = 0x812d;
    break;
  case REPEAT_GL:
    local_c = 0x2901;
    break;
  default:
    local_10 = wrapMode;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Can\'t map wrap mode",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  case MIRRORED_REPEAT_GL:
    local_c = 0x8370;
  }
  return local_c;
}

Assistant:

deUint32 getGLWrapMode (tcu::Sampler::WrapMode wrapMode)
{
	DE_ASSERT(wrapMode != tcu::Sampler::WRAPMODE_LAST);
	switch (wrapMode)
	{
		case tcu::Sampler::CLAMP_TO_EDGE:		return GL_CLAMP_TO_EDGE;
		case tcu::Sampler::CLAMP_TO_BORDER:		return GL_CLAMP_TO_BORDER;
		case tcu::Sampler::REPEAT_GL:			return GL_REPEAT;
		case tcu::Sampler::MIRRORED_REPEAT_GL:	return GL_MIRRORED_REPEAT;
		default:
			throw tcu::InternalError("Can't map wrap mode");
	}
}